

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::analyzeFinal(Solver *this,CRef cr,vec<Minisat::Lit> *out_conflict)

{
  int iVar1;
  Lit LVar2;
  CRef CVar3;
  int iVar4;
  Clause *this_00;
  char *pcVar5;
  int *piVar6;
  Lit *pLVar7;
  Clause *this_01;
  vec<char> *this_02;
  long in_RDI;
  int i_2;
  int j;
  Clause *c_1;
  Var x;
  int i_1;
  int i;
  Clause *c;
  undefined4 in_stack_ffffffffffffff48;
  Ref in_stack_ffffffffffffff4c;
  Solver *in_stack_ffffffffffffff50;
  int local_58;
  uint local_4c;
  int local_30;
  int local_24;
  
  vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)in_stack_ffffffffffffff50,
             SUB41(in_stack_ffffffffffffff4c >> 0x18,0));
  iVar1 = decisionLevel((Solver *)0x134f74);
  if (iVar1 != 0) {
    this_00 = ClauseAllocator::operator[]
                        ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    for (local_24 = 0; iVar1 = Clause::size(this_00), local_24 < iVar1; local_24 = local_24 + 1) {
      LVar2 = Clause::operator[](this_00,local_24);
      var(LVar2);
      iVar1 = level(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      if (0 < iVar1) {
        LVar2 = Clause::operator[](this_00,local_24);
        iVar1 = var(LVar2);
        pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),iVar1);
        *pcVar5 = '\x01';
      }
    }
    local_30 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
    while( true ) {
      local_30 = local_30 + -1;
      piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x360),0);
      if (local_30 < *piVar6) break;
      pLVar7 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),local_30);
      iVar1 = var((Lit)pLVar7->x);
      pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),iVar1);
      if (*pcVar5 != '\0') {
        CVar3 = reason(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        if (CVar3 == 0xffffffff) {
          pLVar7 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),local_30);
          operator~((Lit)pLVar7->x);
          vec<Minisat::Lit>::push
                    ((vec<Minisat::Lit> *)in_stack_ffffffffffffff50,
                     (Lit *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        }
        else {
          reason(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          this_01 = ClauseAllocator::operator[]
                              ((ClauseAllocator *)in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff4c);
          iVar4 = Clause::size(this_01);
          for (local_4c = (uint)(iVar4 != 2); iVar4 = Clause::size(this_01), (int)local_4c < iVar4;
              local_4c = local_4c + 1) {
            LVar2 = Clause::operator[](this_01,local_4c);
            var(LVar2);
            iVar4 = level(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            if (0 < iVar4) {
              LVar2 = Clause::operator[](this_01,local_4c);
              iVar4 = var(LVar2);
              pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),iVar4);
              *pcVar5 = '\x01';
            }
          }
          *(long *)(in_RDI + 0x208) = *(long *)(in_RDI + 0x208) + 1;
        }
        pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x570),iVar1);
        *pcVar5 = '\0';
      }
    }
    for (local_58 = 0; iVar1 = Clause::size(this_00), local_58 < iVar1; local_58 = local_58 + 1) {
      this_02 = (vec<char> *)(in_RDI + 0x570);
      LVar2 = Clause::operator[](this_00,local_58);
      iVar1 = var(LVar2);
      pcVar5 = vec<char>::operator[](this_02,iVar1);
      *pcVar5 = '\0';
    }
  }
  return;
}

Assistant:

void Solver::analyzeFinal(const CRef cr, vec<Lit> &out_conflict)
{
    out_conflict.clear();

    if (decisionLevel() == 0) return;

    const Clause &c = ca[cr];
    for (int i = 0; i < c.size(); ++i) {
        if (level(var(c[i])) > 0) seen[var(c[i])] = 1;
    }

    for (int i = trail.size() - 1; i >= trail_lim[0]; i--) {
        Var x = var(trail[i]);
        if (seen[x]) {
            if (reason(x) == CRef_Undef) {
                assert(level(x) > 0);
                out_conflict.push(~trail[i]);
            } else {
                const Clause &c = ca[reason(x)];
                for (int j = c.size() == 2 ? 0 : 1; j < c.size(); j++)
                    if (level(var(c[j])) > 0) seen[var(c[j])] = 1;
                statistics.solveSteps++;
            }
            seen[x] = 0;
        }
    }

    for (int i = 0; i < c.size(); ++i) seen[var(c[i])] = 0;
}